

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::AllocPages<false>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint pageCount)

{
  PageBitVector *this_00;
  undefined4 *puVar1;
  PageAllocatorBaseCommon *pPVar2;
  HANDLE pVVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  BVIndex BVar7;
  uint uVar8;
  BOOL BVar9;
  char *lpAddress;
  HANDLE pVVar10;
  AllocatorType *pAVar11;
  BVIndex BVar12;
  undefined8 *in_FS_OFFSET;
  uintptr_t mask;
  DWORD local_44;
  undefined4 *puStack_40;
  DWORD oldProtect;
  char *local_38;
  
  BVar12 = this->freePageCount;
  if (BVar12 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar5) goto LAB_00283d20;
    *puVar1 = 0;
    BVar12 = this->freePageCount;
  }
  this_00 = &this->freePages;
  BVar7 = BVStatic<272UL>::Count(this_00);
  if (BVar12 != BVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar5) goto LAB_00283d20;
    *puVar1 = 0;
  }
  if (this->freePageCount < pageCount) {
LAB_00283a1d:
    local_38 = (char *)0x0;
  }
  else {
    bVar5 = IsFull(this);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x158,"(!IsFull())","!IsFull()");
      if (!bVar5) {
LAB_00283d20:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar1 = 0;
      puStack_40 = puVar1;
    }
    else {
      puStack_40 = (undefined4 *)*in_FS_OFFSET;
    }
    local_38 = (char *)0x0;
    BVar7 = BVStatic<272UL>::GetNextBit(this_00,0);
    for (BVar12 = BVar7; BVar12 != 0xffffffff; BVar12 = BVStatic<272UL>::GetNextBit(this_00,BVar12))
    {
      pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               super_SegmentBaseCommon.allocator;
      pAVar11 = &pPVar2[-1].allocatorType;
      if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
        pAVar11 = (AllocatorType *)0x0;
      }
      if (pAVar11[0x28] <= BVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = puStack_40;
        *puStack_40 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar5) goto LAB_00283d20;
        *puVar1 = 0;
      }
      uVar8 = GetAvailablePageCount(this);
      if (uVar8 - BVar12 < pageCount) {
        return local_38;
      }
      if (pageCount == 1) {
        lpAddress = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                    (BVar7 << 0xc);
        BVar12 = BVar7;
LAB_00283bd9:
        BVStatic<272UL>::ClearRange(this_00,BVar12,pageCount);
        BVar7 = this->freePageCount - pageCount;
        this->freePageCount = BVar7;
        BVar12 = BVStatic<272UL>::Count(this_00);
        puVar1 = puStack_40;
        if (BVar7 != BVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                             "freePageCount == (uint)this->GetCountOfFreePages()");
          if (!bVar5) goto LAB_00283d20;
          *puVar1 = 0;
        }
        pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        pAVar11 = &pPVar2[-1].allocatorType;
        if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
          pAVar11 = (AllocatorType *)0x0;
        }
        pVVar3 = *(HANDLE *)(pAVar11 + 0x4a);
        pVVar10 = GetCurrentProcess();
        if (pVVar3 != pVVar10) {
          return lpAddress;
        }
        BVar9 = VirtualProtect(lpAddress,(ulong)(pageCount << 0xc),4,&local_44);
        if (BVar9 != 0) {
          if (local_44 == 1) {
            return lpAddress;
          }
          AssertCount = AssertCount + 1;
          local_38 = lpAddress;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x183,"(oldProtect == 0x01)","oldProtect == PAGE_NOACCESS");
          if (bVar5) {
            *puVar1 = 0;
            return local_38;
          }
          goto LAB_00283d20;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x180,"((0))","UNREACHED");
        if (!bVar5) goto LAB_00283d20;
        *puVar1 = 0;
        goto LAB_00283a1d;
      }
      BVar6 = BVStatic<272UL>::TestRange(this_00,BVar12,pageCount);
      if (BVar6 == '\0') {
        BVar12 = BVar12 + 1;
      }
      else {
        lpAddress = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                    (BVar12 << 0xc);
        if ((pageCount == 0) || (((ulong)pageCount * 0x1000 - 1 & (ulong)lpAddress) == 0))
        goto LAB_00283bd9;
        BVar12 = BVar12 + (int)((ulong)lpAddress % ((ulong)pageCount * 0x1000) >> 0xc);
        pPVar2 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        pAVar11 = &pPVar2[-1].allocatorType;
        if (pPVar2 == (PageAllocatorBaseCommon *)0x0) {
          pAVar11 = (AllocatorType *)0x0;
        }
        if (pAVar11[0x28] <= BVar12) {
          return local_38;
        }
      }
    }
  }
  return local_38;
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}